

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool __thiscall
sentencepiece::string_util::lexical_cast<long>(string_util *this,string_view arg,long *result)

{
  ostream *poVar1;
  istream *piVar2;
  bool bVar3;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,(char *)arg._M_len);
  if (((byte)poVar1[*(long *)(*(long *)poVar1 + -0x18) + 0x20] & 5) == 0) {
    piVar2 = std::istream::_M_extract<long>((long *)asStack_198);
    bVar3 = ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0;
  }
  else {
    bVar3 = false;
  }
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return bVar3;
}

Assistant:

inline bool lexical_cast(absl::string_view arg, Target *result) {
  std::stringstream ss;
  return (ss << arg.data() && ss >> *result);
}